

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O0

void get_mv_projection(MV *output,MV ref,int num,int den)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  undefined4 in_ESI;
  undefined2 *in_RDI;
  int clamp_min;
  int clamp_max;
  int mv_col;
  int mv_row;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  short local_4;
  short sStack_2;
  
  local_2c = in_ECX;
  if (0x1e < in_ECX) {
    local_2c = 0x1f;
  }
  if (in_EDX < 1) {
    local_38 = in_EDX;
    if (in_EDX < -0x1e) {
      local_38 = -0x1f;
    }
    local_34 = local_38;
  }
  else {
    local_30 = in_EDX;
    if (0x1e < in_EDX) {
      local_30 = 0x1f;
    }
    local_34 = local_30;
  }
  local_4 = (short)in_ESI;
  if (local_4 * local_34 * div_mult[local_2c] < 0) {
    local_3c = -(0x2000 - local_4 * local_34 * div_mult[local_2c] >> 0xe);
  }
  else {
    local_3c = local_4 * local_34 * div_mult[local_2c] + 0x2000 >> 0xe;
  }
  sStack_2 = (short)((uint)in_ESI >> 0x10);
  if (sStack_2 * local_34 * div_mult[local_2c] < 0) {
    local_40 = -(0x2000 - sStack_2 * local_34 * div_mult[local_2c] >> 0xe);
  }
  else {
    local_40 = sStack_2 * local_34 * div_mult[local_2c] + 0x2000 >> 0xe;
  }
  iVar1 = clamp(local_3c,-0x3fff,0x3fff);
  *in_RDI = (short)iVar1;
  iVar1 = clamp(local_40,-0x3fff,0x3fff);
  in_RDI[1] = (short)iVar1;
  return;
}

Assistant:

static inline void get_mv_projection(MV *output, MV ref, int num, int den) {
  den = AOMMIN(den, MAX_FRAME_DISTANCE);
  num = num > 0 ? AOMMIN(num, MAX_FRAME_DISTANCE)
                : AOMMAX(num, -MAX_FRAME_DISTANCE);
  const int mv_row =
      ROUND_POWER_OF_TWO_SIGNED(ref.row * num * div_mult[den], 14);
  const int mv_col =
      ROUND_POWER_OF_TWO_SIGNED(ref.col * num * div_mult[den], 14);
  const int clamp_max = MV_UPP - 1;
  const int clamp_min = MV_LOW + 1;
  output->row = (int16_t)clamp(mv_row, clamp_min, clamp_max);
  output->col = (int16_t)clamp(mv_col, clamp_min, clamp_max);
}